

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Data_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Minefield_Data_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_Data_PDU *this)

{
  pointer puVar1;
  pointer pMVar2;
  KString *pKVar3;
  ostream *poVar4;
  ostream *poVar5;
  ulong uVar6;
  ushort uVar7;
  pointer puVar8;
  pointer pMVar9;
  KStringStream ss;
  KString local_3e8;
  KString *local_3c8;
  KString local_3c0;
  long *local_3a0;
  long local_398;
  long local_390 [2];
  KString local_380;
  KString local_360;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_360,(Header7 *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_360._M_dataplus._M_p,local_360._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-Minefield Data PDU-\n",0x15);
  Minefield_Header::GetAsString_abi_cxx11_(&local_380,&this->super_Minefield_Header);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_380._M_dataplus._M_p,local_380._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Requesting ID: ",0xf);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_3c0,&this->m_ReqID);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar4 = (ostream *)(local_340 + 0x10);
  local_3e8._M_dataplus._M_p._0_1_ = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_3e8,1);
  if (local_3c0._M_string_length != 0) {
    uVar7 = 1;
    uVar6 = 0;
    do {
      local_3e8._M_dataplus._M_p._0_1_ = local_3c0._M_dataplus._M_p[uVar6];
      if ((local_3c0._M_string_length - 1 == uVar6) || ((char)local_3e8._M_dataplus._M_p != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_3e8,1);
      }
      else {
        local_3e8._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_3e8,1);
        local_3e8._M_dataplus._M_p._0_1_ = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_3e8,1);
      }
      uVar6 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar6 < local_3c0._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_3a0,local_398);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Minefield Sequence Number: ",0x1b);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Request ID: ",0xc);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"PDU Sequence Number: ",0x15);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Number Of PDU\'s: ",0x11);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Number Of Mines: ",0x11);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Number Of Sensor Types: ",0x18);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  DATA_TYPE::MinefieldDataFilter::GetAsString_abi_cxx11_((KString *)local_340,&this->m_DataFilter);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Mine Type: ",0xb);
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_3e8,&this->m_MineTyp);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)CONCAT71(local_3e8._M_dataplus._M_p._1_7_,
                                              (char)local_3e8._M_dataplus._M_p),
                      local_3e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Sensor Types:\n",0xe);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_3e8._M_dataplus._M_p._1_7_,(char)local_3e8._M_dataplus._M_p) !=
      &local_3e8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_3e8._M_dataplus._M_p._1_7_,(char)local_3e8._M_dataplus._M_p),
                    local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((ostream *)local_340._0_8_ != poVar4) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0,local_390[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  local_3c8 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  puVar1 = (this->m_vui16SensorTypes).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar8 = (this->m_vui16SensorTypes).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\t",1);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Mines:\n",7);
  pMVar9 = (this->m_vMines).
           super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>._M_impl
           .super__Vector_impl_data._M_start;
  pMVar2 = (this->m_vMines).
           super__Vector_base<KDIS::DATA_TYPE::Mine,_std::allocator<KDIS::DATA_TYPE::Mine>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pMVar9 != pMVar2) {
    do {
      (*(pMVar9->super_MinefieldDataFilter).super_DataTypeBase._vptr_DataTypeBase[2])
                (local_340,pMVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
      if ((ostream *)local_340._0_8_ != poVar4) {
        operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
      }
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != pMVar2);
  }
  pKVar3 = local_3c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar3;
}

Assistant:

KString Minefield_Data_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Minefield Data PDU-\n"
       << Minefield_Header::GetAsString()
       << "Requesting ID: "             << IndentString( m_ReqID.GetAsString(), 1 )
       << "Minefield Sequence Number: " << m_SeqNumUnion.m_ui16SeqNum
       << "Request ID: "                << ( KUINT16 )m_ui8ReqID        << "\n"
       << "PDU Sequence Number: "       << ( KUINT16 )m_ui8PduSeqNum    << "\n"
       << "Number Of PDU's: "           << ( KUINT16 )m_ui8NumPdus      << "\n"
       << "Number Of Mines: "           << ( KUINT16 )m_ui8NumMines     << "\n"
       << "Number Of Sensor Types: "    << ( KUINT16 )m_ui8NumSensTyp   << "\n"
       << m_DataFilter.GetAsString()
       << "Mine Type: " << m_MineTyp.GetAsString()
       << "Sensor Types:\n";

    // Sensor Types
    vector<KUINT16>::const_iterator citrSt = m_vui16SensorTypes.begin();
    vector<KUINT16>::const_iterator citrStEnd = m_vui16SensorTypes.end();
    for( ; citrSt != citrStEnd; ++citrSt )
    {
        ss <<  "\t" << *citrSt << "\n";
    }

    ss << "Mines:\n";

    vector<Mine>::const_iterator citrMn = m_vMines.begin();
    vector<Mine>::const_iterator citrMnEnd = m_vMines.end();
    for( ; citrMn != citrMnEnd; ++citrMn )
    {
        ss << citrMn->GetAsString();
    }

    return ss.str();
}